

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.h
# Opt level: O0

bool __thiscall
Js::BuiltInPropertyRecord<7>::Equals(BuiltInPropertyRecord<7> *this,JavascriptString *str)

{
  charcount_t length;
  char16 *str_00;
  PropertyId local_2c;
  PropertyRecord *local_28;
  PropertyRecord *propRecord;
  JavascriptString *str_local;
  BuiltInPropertyRecord<7> *this_local;
  
  local_28 = (PropertyRecord *)0x0;
  propRecord = (PropertyRecord *)str;
  str_local = (JavascriptString *)this;
  (*(str->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x61])(str,&local_28,0);
  if (local_28 == (PropertyRecord *)0x0) {
    str_00 = JavascriptString::GetString((JavascriptString *)propRecord);
    length = JavascriptString::GetLength((JavascriptString *)propRecord);
    this_local._7_1_ = Equals(this,str_00,length);
  }
  else {
    local_2c = PropertyRecord::GetPropertyId(local_28);
    this_local._7_1_ = Equals(this,&local_2c);
  }
  return this_local._7_1_;
}

Assistant:

bool Equals(JavascriptString * str) const
        {
            const PropertyRecord * propRecord = nullptr;
            str->GetPropertyRecord(&propRecord);

            if (propRecord == nullptr)
            {
                return Equals(str->GetString(), str->GetLength());
            }
            else
            {
                return Equals(propRecord->GetPropertyId());
            }
        }